

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_quote(Curl_easy *data,_Bool init,ftpstate instate)

{
  anon_union_240_12_f950f0f9_for_proto *pp;
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  uint uVar3;
  int iVar4;
  CURLcode CVar5;
  long lVar6;
  undefined8 *puVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  lVar6 = 0x540;
  if (instate - FTP_RETR_PREQUOTE < 3) {
    lVar6 = *(long *)(&DAT_0015b100 + (ulong)(instate - FTP_RETR_PREQUOTE) * 8);
  }
  pcVar1 = data->conn;
  puVar7 = *(undefined8 **)((long)&data->magic + lVar6);
  CVar5 = CURLE_OK;
  iVar4 = 0;
  if (!init) {
    iVar4 = (pcVar1->proto).ftpc.count1 + 1;
  }
  pFVar2 = (data->req).p.file;
  pp = &pcVar1->proto;
  (pcVar1->proto).ftpc.count1 = iVar4;
  if (puVar7 == (undefined8 *)0x0) {
    bVar10 = false;
  }
  else {
    iVar4 = (pcVar1->proto).ftpc.count1;
    bVar11 = true;
    if (iVar4 < 1) {
      bVar10 = true;
    }
    else {
      iVar9 = 1;
      do {
        puVar7 = (undefined8 *)puVar7[1];
        bVar10 = puVar7 != (undefined8 *)0x0;
        if (iVar4 <= iVar9) break;
        iVar9 = iVar9 + 1;
      } while (puVar7 != (undefined8 *)0x0);
    }
    if (bVar10) {
      pcVar8 = (char *)*puVar7;
      uVar3 = (uint)(*pcVar8 == '*');
      (pcVar1->proto).ftpc.count2 = uVar3;
      CVar5 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",pcVar8 + uVar3);
      bVar11 = CVar5 == CURLE_OK;
      bVar10 = bVar11;
      if (bVar11) {
        (data->conn->proto).ftpc.state = instate;
      }
    }
    else {
      CVar5 = CURLE_OK;
      bVar10 = false;
    }
    if (!bVar11) {
      return CVar5;
    }
  }
  if (!bVar10) {
    if (instate == FTP_RETR_PREQUOTE) {
      if (pFVar2->fd == 0) {
        lVar6 = (pcVar1->proto).ftpc.known_filesize;
        if (lVar6 != -1) {
          Curl_pgrsSetDownloadSize(data,lVar6);
          CVar5 = ftp_state_retr(data,(pcVar1->proto).ftpc.known_filesize);
          return CVar5;
        }
        if ((((data->set).field_0x9a4 & 0x10) == 0) && (((data->state).field_0x662 & 1) == 0)) {
          CVar5 = Curl_pp_sendf(data,&(pp->ftpc).pp,"SIZE %s",(pcVar1->proto).ftpc.file);
          if (CVar5 == CURLE_OK) {
            (data->conn->proto).ftpc.state = FTP_RETR_SIZE;
            CVar5 = CURLE_OK;
          }
        }
        else {
          CVar5 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(pcVar1->proto).ftpc.file);
          if (CVar5 == CURLE_OK) {
            (data->conn->proto).ftpc.state = FTP_RETR;
            CVar5 = CURLE_OK;
          }
        }
      }
      else {
        (data->conn->proto).ftpc.state = FTP_STOP;
      }
    }
    else {
      if (instate == FTP_STOR_PREQUOTE) {
        CVar5 = ftp_state_ul_setup(data,false);
        return CVar5;
      }
      if (instate != FTP_POSTQUOTE) {
        if ((pcVar1->proto).ftpc.cwddone == true) {
LAB_0011bd04:
          CVar5 = ftp_state_mdtm(data);
          return CVar5;
        }
        (pcVar1->proto).ftpc.count2 = 0;
        *(uint *)((long)&pcVar1->proto + 0xcc) = (uint)((data->set).ftp_create_missing_dirs == 2);
        if (((((pcVar1->bits).field_0x4 & 0x40) == 0) ||
            (pcVar8 = (pcVar1->proto).ftpc.entrypath, pcVar8 == (char *)0x0)) ||
           (((pcVar1->proto).ftpc.dirdepth != 0 && (**(pcVar1->proto).ftpc.dirs == '/')))) {
          if ((pcVar1->proto).ftpc.dirdepth == 0) goto LAB_0011bd04;
          (pcVar1->proto).ftpc.cwdcount = 1;
          pcVar8 = *(pcVar1->proto).ftpc.dirs;
        }
        else {
          (pcVar1->proto).ftpc.cwdcount = 0;
        }
        CVar5 = Curl_pp_sendf(data,&(pp->ftpc).pp,"CWD %s",pcVar8);
        if (CVar5 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_CWD;
          CVar5 = CURLE_OK;
        }
      }
    }
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_quote(struct Curl_easy *data,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(result)
        return result;
      state(data, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(data, conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != PPTRANSFER_BODY)
        state(data, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(data, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl || data->state.prefer_ascii) {
            /* 'ignorecl' is used to support download of growing files.  It
               prevents the state machine from requesting the file size from
               the server.  With an unknown file size the download continues
               until the server terminates it, otherwise the client stops if
               the received byte count exceeds the reported file size.  Set
               option CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this
               behavior.

               In addition: asking for the size for 'TYPE A' transfers is not
               constructive since servers don't report the converted size. So
               skip it.
            */
            result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
            if(!result)
              state(data, FTP_RETR);
          }
          else {
            result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
            if(!result)
              state(data, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(data, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}